

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.h
# Opt level: O0

void __thiscall ser::MetainfoSet::ExtractValue<float>(MetainfoSet *this,string *key,float *value)

{
  bool bVar1;
  SerializationException *this_00;
  pointer ppVar2;
  float fVar3;
  SerializationException exception_1;
  ostringstream msg_1;
  bad_any_cast *anon_var_0;
  any *anyvalue;
  SerializationException exception;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string msg;
  _Self local_28;
  const_iterator iter;
  float *value_local;
  string *key_local;
  MetainfoSet *this_local;
  
  iter._M_node = (_Base_ptr)value;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ::find(&this->data_,key);
  msg.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ::end(&this->data_);
  bVar1 = std::operator==(&local_28,(_Self *)((long)&msg.field_2 + 8));
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>
             ::operator->(&local_28);
    fVar3 = boost::any_cast<float>(&ppVar2->second);
    (iter._M_node)->_M_color = (_Rb_tree_color)fVar3;
    return;
  }
  std::operator+(&local_70,"Error: metainfo with key = ",key);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70," does not exist in set\n");
  std::__cxx11::string::~string((string *)&local_70);
  SerializationException::SerializationException((SerializationException *)&anyvalue);
  SerializationException::Init((SerializationException *)&anyvalue,(string *)local_50);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)&anyvalue);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

inline void ExtractValue(const std::string& key, ValueType& value) const
        {
            std::map<std::string, boost::any>::const_iterator iter = data_.find(key);

            // Check that type exists
            if (iter == data_.end())
            {
                std::string msg = "Error: metainfo with key = " + key + " does not exist in set\n";
                SerializationException exception;
                exception.Init(msg);
                throw exception;
            }

            // Check type
            try
            {
                const boost::any& anyvalue = iter->second;
                value = boost::any_cast<ValueType>(anyvalue);
            }
            catch(boost::bad_any_cast&)
            {
                std::ostringstream msg;
                msg << "Error: type mismatch with metainfo " << key << "\n";
                msg << "Stored metainfo has type " << iter->second.type().name() << "\n";
                msg << "Provided reference has type " << typeid(ValueType).name() << "\n";
                SerializationException exception;
                exception.Init(msg.str());
                throw exception;
            }
        }